

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O3

void __thiscall FatSystem::enableCache(FatSystem *this)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  key_type local_24;
  
  if (this->cacheEnabled == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Computing FAT cache...",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    local_24 = 0;
    if (this->totalClusters != 0) {
      uVar3 = 0;
      do {
        uVar1 = nextCluster(this,(uint)uVar3,0);
        puVar2 = (uint *)std::
                         map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         ::operator[](&this->cache,&local_24);
        *puVar2 = uVar1;
        uVar3 = (long)local_24 + 1;
        local_24 = (key_type)uVar3;
      } while (uVar3 < this->totalClusters);
    }
    this->cacheEnabled = true;
  }
  return;
}

Assistant:

void FatSystem::enableCache()
{
    if (!cacheEnabled) {
        cout << "Computing FAT cache..." << endl;
        for (int cluster=0; cluster<totalClusters; cluster++) {
            cache[cluster] = nextCluster(cluster);
        }

        cacheEnabled = true;
    }
}